

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O2

QToken * QToken::wildcard(void)

{
  int i;
  int iVar1;
  QToken *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> options;
  uchar local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,0x100);
  for (iVar1 = 0; iVar1 != 0x100; iVar1 = iVar1 + 1) {
    local_39 = (uchar)iVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,&local_39);
  }
  (in_RDI->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
  (in_RDI->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
  (in_RDI->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_38);
  return in_RDI;
}

Assistant:

QToken QToken::wildcard() {
    std::vector<uint8_t> options;
    options.reserve(256);
    for (int i = 0; i < 256; i++) {
        options.push_back(static_cast<uint8_t>(i));
    }
    return QToken(std::move(options));
}